

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O2

int mapEndBiome(EndNoise *en,int *out,int x,int z,int w,int h)

{
  long lVar1;
  double dVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  void *__ptr;
  ulong uVar6;
  ushort *puVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  void *pvVar11;
  ulong uVar12;
  short sVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  int local_90;
  
  lVar21 = (long)(w + 0x1a);
  lVar15 = (long)(h + 0x1a);
  __ptr = malloc(lVar21 * lVar15 * 2);
  lVar26 = (long)x;
  lVar14 = (long)z;
  lVar17 = 0;
  lVar18 = 0;
  if (0 < lVar21) {
    lVar18 = lVar21;
  }
  if (lVar15 < 1) {
    lVar15 = lVar17;
  }
  lVar10 = (long)w;
  pvVar11 = __ptr;
  for (; lVar17 != lVar15; lVar17 = lVar17 + 1) {
    lVar22 = lVar14 + -0xc + lVar17;
    for (lVar20 = 0; lVar18 != lVar20; lVar20 = lVar20 + 1) {
      lVar1 = lVar26 + -0xc + lVar20;
      if ((ulong)(lVar1 * lVar1 + lVar22 * lVar22) < 0x1001) {
        sVar13 = 0;
      }
      else {
        dVar2 = sampleSimplex2D(&en->perlin,(double)lVar1,(double)lVar22);
        if (-0.8999999761581421 <= dVar2) {
          sVar13 = 0;
        }
        else {
          sVar13 = (short)(((long)(ABS((float)lVar1) * 3439.0 + ABS((float)lVar22) * 147.0) &
                           0xffffffffU) % 0xd) + 9;
          sVar13 = sVar13 * sVar13;
        }
      }
      *(short *)((long)pvVar11 + lVar20 * 2) = sVar13;
    }
    pvVar11 = (void *)((long)pvVar11 + lVar10 * 2 + 0x34);
  }
  uVar12 = 0;
  lVar15 = 0;
  if (0 < lVar10) {
    lVar15 = lVar10;
  }
  uVar6 = (ulong)(uint)h;
  if (h < 1) {
    uVar6 = uVar12;
  }
  uVar19 = lVar14 * 2;
  for (; uVar12 != uVar6; uVar12 = uVar12 + 1) {
    lVar18 = uVar12 + lVar14;
    lVar17 = lVar18 * 2 + 1;
    uVar3 = (uint)lVar17;
    local_90 = uVar3 * uVar3;
    uVar4 = -uVar3;
    if (0 < (int)uVar3) {
      uVar4 = uVar3;
    }
    for (lVar22 = 0; iVar5 = 9, lVar22 != lVar15; lVar22 = lVar22 + 1) {
      lVar20 = lVar22 + lVar26;
      if (0x1000 < (ulong)(lVar20 * lVar20 + lVar18 * lVar18)) {
        lVar1 = lVar20 * 2 + 1;
        uVar25 = (uint)lVar1;
        if ((en->mc < 0x11) || (iVar5 = 0x2b, -1 < (int)(uVar25 * uVar25 + local_90))) {
          uVar16 = (ulong)((uint)((int)lVar20 * 2) >> 0x1f);
          uVar23 = -uVar25;
          if (0 < (int)uVar25) {
            uVar23 = uVar25;
          }
          uVar25 = (uVar25 * uVar25 + uVar3 * uVar3) * 0x40;
          if (0xf < uVar4) {
            uVar25 = 0x3841;
          }
          if (0xf < uVar23) {
            uVar25 = 0x3841;
          }
          puVar7 = (ushort *)
                   ((long)__ptr +
                   (lVar1 / 2) * 2 + (lVar17 / 2 - lVar14) * lVar21 * 2 + lVar26 * -2 + 0x30);
          for (lVar20 = 0; lVar20 != 0x19; lVar20 = lVar20 + 1) {
            uVar8 = (uint)*(ushort *)
                           (&DAT_00180650 + (ulong)((uint)(uVar19 >> 0x1e) & 2) + lVar20 * 2);
            uVar23 = uVar25;
            if ((puVar7[-0x18] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180650 + uVar16 * 2) + uVar8) * (uint)puVar7[-0x18],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-0x17] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_00180652 + uVar16 * 2) + uVar8) * (uint)puVar7[-0x17],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-0x16] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180654 + uVar16 * 2) + uVar8) * (uint)puVar7[-0x16],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-0x15] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_00180656 + uVar16 * 2) + uVar8) * (uint)puVar7[-0x15],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-0x14] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180658 + uVar16 * 2) + uVar8) * (uint)puVar7[-0x14],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-0x13] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_0018065a + uVar16 * 2) + uVar8) * (uint)puVar7[-0x13],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-0x12] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_0018065c + uVar16 * 2) + uVar8) * (uint)puVar7[-0x12],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-0x11] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_0018065e + uVar16 * 2) + uVar8) * (uint)puVar7[-0x11],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar9 = (uint)*(ushort *)
                           (&DAT_00180650 + (ulong)((uint)(uVar19 >> 0x1e) & 2) + lVar20 * 2);
            uVar23 = uVar25;
            if ((puVar7[-0x10] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180660 + uVar16 * 2) + uVar9) * (uint)puVar7[-0x10],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-0xf] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_00180662 + uVar16 * 2) + uVar9) * (uint)puVar7[-0xf],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-0xe] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180664 + uVar16 * 2) + uVar9) * (uint)puVar7[-0xe],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-0xd] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_00180666 + uVar16 * 2) + uVar9) * (uint)puVar7[-0xd],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-0xc] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180668 + uVar16 * 2) + uVar9) * (uint)puVar7[-0xc],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-0xb] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_0018066a + uVar16 * 2) + uVar9) * (uint)puVar7[-0xb],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-10] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_0018066c + uVar16 * 2) + uVar9) * (uint)puVar7[-10],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-9] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_0018066e + uVar16 * 2) + uVar9) * (uint)puVar7[-9],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-8] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180670 + uVar16 * 2) + uVar9) * (uint)puVar7[-8],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-7] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_00180672 + uVar16 * 2) + uVar9) * (uint)puVar7[-7],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-6] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180674 + uVar16 * 2) + uVar9) * (uint)puVar7[-6],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-5] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_00180676 + uVar16 * 2) + uVar9) * (uint)puVar7[-5],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-4] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_00180678 + uVar16 * 2) + uVar9) * (uint)puVar7[-4],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar25 = uVar23;
            if ((puVar7[-3] != 0) &&
               (uVar25 = (*(ushort *)(&DAT_0018067a + uVar16 * 2) + uVar9) * (uint)puVar7[-3],
               uVar23 <= uVar25)) {
              uVar25 = uVar23;
            }
            uVar23 = uVar25;
            if ((puVar7[-2] != 0) &&
               (uVar23 = (*(ushort *)(&DAT_0018067c + uVar16 * 2) + uVar9) * (uint)puVar7[-2],
               uVar25 <= uVar23)) {
              uVar23 = uVar25;
            }
            uVar24 = uVar23;
            if ((puVar7[-1] != 0) &&
               (uVar24 = (*(ushort *)(&DAT_0018067e + uVar16 * 2) + uVar9) * (uint)puVar7[-1],
               uVar23 <= uVar24)) {
              uVar24 = uVar23;
            }
            uVar25 = uVar24;
            if ((*puVar7 != 0) &&
               (uVar25 = (*(ushort *)(&DAT_00180680 + uVar16 * 2) + uVar8) * (uint)*puVar7,
               uVar24 <= uVar25)) {
              uVar25 = uVar24;
            }
            puVar7 = puVar7 + lVar10 + 0x1a;
          }
          iVar5 = 0x2a;
          if ((0xe0f < uVar25) && (iVar5 = 0x29, 10000 < uVar25)) {
            iVar5 = (uint)(uVar25 < 0x3841) * 3 + 0x28;
          }
        }
      }
      out[uVar12 * lVar10 + lVar22] = iVar5;
    }
    uVar19 = uVar19 + 2;
  }
  free(__ptr);
  return 0;
}

Assistant:

int mapEndBiome(const EndNoise *en, int *out, int x, int z, int w, int h)
{
    int64_t i, j;
    int64_t hw = w + 26;
    int64_t hh = h + 26;
    uint16_t *hmap = (uint16_t*) malloc(sizeof(*hmap) * hw * hh);

    for (j = 0; j < hh; j++)
    {
        for (i = 0; i < hw; i++)
        {
            int64_t rx = x + i - 12;
            int64_t rz = z + j - 12;
            uint64_t rsq = rx * rx + rz * rz;
            uint16_t v = 0;
            if (rsq > 4096 && sampleSimplex2D(&en->perlin, rx, rz) < -0.9f)
            {
                //v = (llabs(rx) * 3439 + llabs(rz) * 147) % 13 + 9;
                v = (unsigned int)(
                        fabsf((float)rx) * 3439.0f + fabsf((float)rz) * 147.0f
                    ) % 13 + 9;
                v *= v;
            }
            hmap[(int64_t)j*hw+i] = v;
        }
    }

    for (j = 0; j < h; j++)
    {
        for (i = 0; i < w; i++)
        {
            int64_t hx = (i+x);
            int64_t hz = (j+z);
            uint64_t rsq = hx * hx + hz * hz;

            if (rsq <= 4096L)
                out[j*w+i] = the_end;
            else
            {
                hx = 2*hx + 1;
                hz = 2*hz + 1;
                if (en->mc > MC_1_13)
                {   // add outer end rings
                    rsq = hx * hx + hz * hz;
                    if ((int)rsq < 0)
                    {
                        out[j*w+i] = end_barrens;
                        continue;
                    }
                }
                uint16_t *p_elev = &hmap[(hz/2-z)*hw + (hx/2-x)];
                out[j*w+i] = getEndBiome(hx, hz, p_elev, hw);
            }
        }
    }

    free(hmap);
    return 0;
}